

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void fs_write_alotof_bufs_with_offset(int add_flags)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  void *__ptr;
  long lVar4;
  void *__ptr_00;
  undefined1 auVar5 [16];
  uv_buf_t uVar6;
  void *eval_b_1;
  void *eval_a_1;
  void *eval_b;
  void *eval_a;
  int filler_len;
  char *filler;
  int64_t offset;
  ulong uStack_40;
  int r;
  size_t index;
  char *buffer;
  uv_buf_t *iovs;
  size_t iovmax;
  size_t iovcount;
  int add_flags_local;
  
  sVar3 = strlen("0123456789");
  iovmax = 0xd431;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  __ptr = malloc(0xd4310);
  if (__ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd78,"iovs","!=","NULL",0,"!=",0);
    abort();
  }
  iVar1 = uv_test_getiovmax();
  iVar2 = uv_fs_open(0,&open_req1,"test_file",add_flags | 0x42,0x180);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd81,"r >= 0");
    abort();
  }
  if (open_req1.result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd82,"open_req1.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req1);
  iov = (uv_buf_t)uv_buf_init("0123456789",sVar3 & 0xffffffff);
  iVar2 = uv_fs_write(0,&write_req,open_req1.result & 0xffffffff,&iov,1,0xffffffffffffffff,0);
  if (iVar2 != (int)sVar3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd87,"r == filler_len");
    abort();
  }
  if (write_req.result != (int)sVar3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd88,"write_req.result == filler_len");
    abort();
  }
  uv_fs_req_cleanup(&write_req);
  lVar4 = (long)iVar2;
  for (uStack_40 = 0; uStack_40 < 0xd431; uStack_40 = uStack_40 + 1) {
    auVar5 = uv_buf_init(test_buf,0xd);
    *(undefined1 (*) [16])((long)__ptr + uStack_40 * 0x10) = auVar5;
  }
  iVar2 = uv_fs_write(0,&write_req,open_req1.result & 0xffffffff,__ptr,0xd431,lVar4,0);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd96,"r >= 0");
    abort();
  }
  if (write_req.result != 0xac67d) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xd97,"(size_t)write_req.result == sizeof(test_buf) * iovcount");
    abort();
  }
  uv_fs_req_cleanup(&write_req);
  __ptr_00 = malloc(0xac67d);
  if (__ptr_00 != (void *)0x0) {
    for (uStack_40 = 0; uStack_40 < 0xd431; uStack_40 = uStack_40 + 1) {
      auVar5 = uv_buf_init((void *)((long)__ptr_00 + uStack_40 * 0xd),0xd);
      *(undefined1 (*) [16])((long)__ptr + uStack_40 * 0x10) = auVar5;
    }
    iVar2 = uv_fs_read(0,&read_req,open_req1.result & 0xffffffff,__ptr,0xd431,lVar4,0);
    if (iVar2 < 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0xda4,"r >= 0");
      abort();
    }
    if (iVar2 == 0xd) {
      iovmax = 1;
    }
    else if ((ulong)(long)iVar1 < 0xd431) {
      iovmax = (long)iVar1;
    }
    if (read_req.result != iovmax * 0xd) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0xda9,"(size_t)read_req.result == sizeof(test_buf) * iovcount");
      abort();
    }
    for (uStack_40 = 0; uStack_40 < iovmax; uStack_40 = uStack_40 + 1) {
      iVar1 = strncmp((char *)((long)__ptr_00 + uStack_40 * 0xd),test_buf,0xd);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
                ,0xdae,"strncmp(buffer + index * sizeof(test_buf), test_buf, sizeof(test_buf)) == 0"
               );
        abort();
      }
    }
    uv_fs_req_cleanup(&read_req);
    free(__ptr_00);
    iVar1 = uv_fs_stat(0,&stat_req,"test_file");
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0xdb4,"r == 0");
      abort();
    }
    if (*(long *)((long)stat_req.ptr + 0x38) != lVar4 + write_req.result) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0xdb6,
              "(int64_t)((uv_stat_t*)stat_req.ptr)->st_size == offset + (int64_t)write_req.result");
      abort();
    }
    uv_fs_req_cleanup(&stat_req);
    uVar6 = (uv_buf_t)uv_buf_init(buf,0x20);
    iov = uVar6;
    iVar1 = uv_fs_read(0,&read_req,open_req1.result & 0xffffffff,&iov,1,lVar4 + write_req.result,0);
    if (iVar1 == 0) {
      if (read_req.result != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
                ,0xdc2,"read_req.result == 0");
        abort();
      }
      uv_fs_req_cleanup(&read_req);
      iVar1 = uv_fs_close(0,&close_req,open_req1.result & 0xffffffff);
      if (iVar1 == 0) {
        if (close_req.result == 0) {
          uv_fs_req_cleanup(&close_req);
          unlink("test_file");
          free(__ptr);
          return;
        }
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
                ,0xdc7,"close_req.result == 0");
        abort();
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c"
              ,0xdc6,"r == 0");
      abort();
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0xdc1,"r == 0");
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          0xd9c,"buffer","!=","NULL",0,"!=",0);
  abort();
}

Assistant:

static void fs_write_alotof_bufs_with_offset(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;
  int64_t offset;
  char* filler;
  int filler_len;

  filler = "0123456789";
  filler_len = strlen(filler);
  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT_NOT_NULL(iovs);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(filler, filler_len);
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == filler_len);
  ASSERT(write_req.result == filler_len);
  uv_fs_req_cleanup(&write_req);
  offset = (int64_t)r;

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  offset,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT_NOT_NULL(buffer);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_read(NULL, &read_req, open_req1.result,
                 iovs, iovcount, offset, NULL);
  ASSERT(r >= 0);
  if (r == sizeof(test_buf))
    iovcount = 1; /* Infer that preadv is not available. */
  else if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  r = uv_fs_stat(NULL, &stat_req, "test_file", NULL);
  ASSERT(r == 0);
  ASSERT((int64_t)((uv_stat_t*)stat_req.ptr)->st_size ==
         offset + (int64_t)write_req.result);
  uv_fs_req_cleanup(&stat_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 offset + write_req.result,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}